

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::Benchmark::Detail::weighted_average_quantile(int k,int q,double *first,double *last)

{
  bool bVar1;
  double *pdVar2;
  double *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  double *__last;
  double *__first;
  double xj1;
  double xj;
  double g;
  int j;
  double idx;
  long count;
  double *local_8;
  
  pdVar2 = (double *)((long)in_RCX - in_RDX >> 3);
  __last = (double *)((double)(((long)pdVar2 + -1) * (long)in_EDI) / (double)in_ESI);
  __first = (double *)((double)__last - (double)(int)(double)__last);
  std::nth_element<double*>(in_RCX,pdVar2,__last);
  local_8 = *(double **)(in_RDX + (long)(int)(double)__last * 8);
  bVar1 = Catch::Detail::directCompare((double)__first,0.0);
  if (!bVar1) {
    pdVar2 = std::min_element<double*>(__first,local_8);
    local_8 = (double *)((double)__first * (*pdVar2 - (double)local_8) + (double)local_8);
  }
  return (double)local_8;
}

Assistant:

double weighted_average_quantile( int k,
                                              int q,
                                              double* first,
                                              double* last ) {
                auto count = last - first;
                double idx = (count - 1) * k / static_cast<double>(q);
                int j = static_cast<int>(idx);
                double g = idx - j;
                std::nth_element(first, first + j, last);
                auto xj = first[j];
                if ( Catch::Detail::directCompare( g, 0 ) ) {
                    return xj;
                }

                auto xj1 = *std::min_element(first + (j + 1), last);
                return xj + g * (xj1 - xj);
            }